

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O2

int64_t __thiscall AviWriter::SeekFile64(AviWriter *this,FILE *fid,int64_t offset,int whence)

{
  int iVar1;
  
  if (fid != (FILE *)0x0) {
    clearerr((FILE *)fid);
    fflush((FILE *)fid);
    iVar1 = fseeko((FILE *)fid,offset,whence);
    return (long)iVar1;
  }
  return -1;
}

Assistant:

int64_t AviWriter::SeekFile64(FILE *fid, int64_t offset, int whence)
{
    if (fid == NULL) return -1;

    clearerr(fid);
    fflush(fid);
#if (defined(__WIN32__) || defined(_WIN32)) && !defined(_WIN32_WCE)
    return _lseeki64(_fileno(fid), offset, whence) == (int64_t)-1 ? -1 : 0;
#else
#if defined(_WIN32_WCE)
    return fseek(fid, (long)(offset), whence);
#else
    return fseeko(fid, (off_t)(offset), whence);
#endif
#endif
}